

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  CircularArray<wabt::Token,_2UL> *this_00;
  undefined8 uVar1;
  Location loc;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  int iVar5;
  bool bVar6;
  Token cur;
  Token local_70;
  
  this_00 = &this->tokens_;
LAB_00133822:
  do {
    while( true ) {
      if (n < (this->tokens_).size_) {
        pvVar4 = CircularArray<wabt::Token,_2UL>::at(this_00,n);
        return pvVar4->token_type_;
      }
      WastLexer::GetToken(&cur,this->lexer_);
      if (cur.token_type_ == LparAnn) break;
LAB_001338ec:
      CircularArray<wabt::Token,_2UL>::push_back(this_00,&cur);
    }
    if ((this->options_->features).annotations_enabled_ != false) {
      if ((this->options_->features).code_metadata_enabled_ == true) {
        local_70.loc.filename = Token::text(&cur);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_70,
                           "metadata.code.",0);
        if (sVar3 == 0) goto LAB_001338ec;
      }
      iVar5 = 1;
      while (0 < iVar5) {
        WastLexer::GetToken(&local_70,this->lexer_);
        cur.loc.filename._M_len = local_70.loc.filename._M_len;
        cur.loc.filename._M_str = local_70.loc.filename._M_str;
        cur.loc.field_1.field_1.offset = local_70.loc.field_1.field_1.offset;
        cur.loc.field_1._8_8_ = local_70.loc.field_1._8_8_;
        uVar1._0_4_ = local_70.token_type_;
        uVar1._4_4_ = local_70._36_4_;
        cur.field_2.text_._M_len = local_70.field_2.text_._M_len;
        cur.field_2.text_._M_str = local_70.field_2.text_._M_str;
        cur.field_2.literal_.text._M_str = local_70.field_2.literal_.text._M_str;
        cur.token_type_ = local_70.token_type_;
        cur._36_4_ = local_70._36_4_;
        uVar2 = cur._32_8_;
        cur.token_type_ = local_70.token_type_;
        if (cur.token_type_ == LparAnn) {
LAB_001338e2:
          iVar5 = iVar5 + 1;
          cur._32_8_ = uVar2;
        }
        else if (cur.token_type_ == Rpar) {
          iVar5 = iVar5 + -1;
          cur._32_8_ = uVar2;
        }
        else {
          bVar6 = cur.token_type_ == Lpar;
          cur._32_8_ = uVar1;
          if (bVar6) goto LAB_001338e2;
        }
      }
      goto LAB_00133822;
    }
    Token::to_string_abi_cxx11_((string *)&local_70,&cur);
    Error(this,0x172963,(char *)local_70.loc.filename._M_len);
    std::__cxx11::string::_M_dispose();
    loc.filename._M_str._0_4_ = (int)cur.loc.filename._M_str;
    loc.filename._M_len = cur.loc.filename._M_len;
    loc.filename._M_str._4_4_ = (int)((ulong)cur.loc.filename._M_str >> 0x20);
    loc.field_1.field_0.line = cur.loc.field_1._0_4_;
    loc.field_1.field_0.first_column = cur.loc.field_1._4_4_;
    loc.field_1.field_0.last_column = (int)cur.loc.field_1._8_8_;
    loc.field_1._12_4_ = (int)((ulong)cur.loc.field_1._8_8_ >> 0x20);
    Token::Token(&local_70,loc,First);
    CircularArray<wabt::Token,_2UL>::push_back(this_00,&local_70);
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation. In that case, we know how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if (options_->features.code_metadata_enabled() &&
          cur.text().find("metadata.code.") == 0) {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}